

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

int __thiscall gvr::PLYReader::open(PLYReader *this,char *__file,int __oflag,...)

{
  string *psVar1;
  pointer ppPVar2;
  pointer ppPVar3;
  PLYElement *pPVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  int iVar8;
  ply_type pVar9;
  ply_type t_value;
  undefined8 uVar10;
  long lVar11;
  IOException *pIVar12;
  size_t i;
  ulong uVar13;
  istream *piVar14;
  ply_encoding local_10c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  format;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  PLYElement *element;
  istream *local_98;
  PLYElement *local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  format.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  format.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  format.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::assign((char *)this);
  uVar13 = 0;
  while( true ) {
    ppPVar2 = (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppPVar3 = (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppPVar3 - (long)ppPVar2 >> 3) <= uVar13) break;
    pPVar4 = ppPVar2[uVar13];
    if (pPVar4 != (PLYElement *)0x0) {
      PLYElement::~PLYElement(pPVar4);
    }
    operator_delete(pPVar4);
    uVar13 = uVar13 + 1;
  }
  if (ppPVar3 != ppPVar2) {
    (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar2;
  }
  piVar14 = (istream *)&this->in;
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 != '\0') {
    std::ifstream::close();
  }
  std::ios::exceptions((int)*(undefined8 *)(*(long *)piVar14 + -0x18) + (int)piVar14);
  std::ifstream::open((char *)piVar14,(_Ios_Openmode)__file);
  cVar5 = std::istream::get();
  cVar6 = std::istream::get();
  cVar7 = std::istream::get();
  if (cVar7 == 'y' && (cVar6 == 'l' && cVar5 == 'p')) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(piVar14,(string *)&line);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(piVar14,(string *)&line);
    gutil::trim((string *)&line);
    gutil::split((vector *)&format,(string *)&line,' ',true);
    if ((((long)format.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)format.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x60) ||
        (iVar8 = std::__cxx11::string::compare
                           ((char *)format.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start), iVar8 != 0)) ||
       (iVar8 = std::__cxx11::string::compare
                          ((char *)(format.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 2)), iVar8 != 0)) {
      pIVar12 = (IOException *)__cxa_allocate_exception(0x28);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     "Unknown ply format or version: ",&line);
      gutil::IOException::IOException(pIVar12,(string *)local_90);
      __cxa_throw(pIVar12,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    }
    iVar8 = std::__cxx11::string::compare
                      ((char *)(format.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar8 == 0) {
      local_10c = ply_ascii;
    }
    else {
      iVar8 = std::__cxx11::string::compare
                        ((char *)(format.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
      if (iVar8 == 0) {
        local_10c = ply_big_endian;
      }
      else {
        iVar8 = std::__cxx11::string::compare
                          ((char *)(format.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
        if (iVar8 != 0) {
          pIVar12 = (IOException *)__cxa_allocate_exception(0x28);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_90,"Unknown ply encoding: ",
                         format.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
          gutil::IOException::IOException(pIVar12,(string *)local_90);
          __cxa_throw(pIVar12,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
        }
        local_10c = ply_little_endian;
      }
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>(piVar14,(string *)&line);
    gutil::trim((string *)&line);
    local_98 = piVar14;
    while (iVar8 = std::__cxx11::string::compare((char *)&line), iVar8 != 0) {
      iVar8 = std::__cxx11::string::compare((ulong)&line,0,(char *)0x7);
      if (iVar8 == 0) {
        element = PLYElement::fromString(&line);
        std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::push_back
                  (&this->list,&element);
      }
      else {
        iVar8 = std::__cxx11::string::compare((ulong)&line,0,(char *)0x7);
        if (iVar8 == 0) {
          local_90[0] = PLYElement::fromString(&line);
          std::vector<gvr::PLYElement*,std::allocator<gvr::PLYElement*>>::
          emplace_back<gvr::PLYElement*>
                    ((vector<gvr::PLYElement*,std::allocator<gvr::PLYElement*>> *)&this->list,
                     local_90);
        }
        else {
          iVar8 = std::__cxx11::string::compare((ulong)&line,0,(char *)0x8);
          pPVar4 = element;
          if (iVar8 == 0) {
            if (element == (PLYElement *)0x0) {
              pIVar12 = (IOException *)__cxa_allocate_exception(0x28);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_90,"Property without an parent element: ",&line);
              gutil::IOException::IOException(pIVar12,(string *)local_90);
              __cxa_throw(pIVar12,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
            }
            list.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            list.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            list.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            gutil::split((vector *)&list,(string *)&line,' ',true);
            iVar8 = std::__cxx11::string::compare
                              ((char *)list.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
            if (iVar8 != 0) {
              pIVar12 = (IOException *)__cxa_allocate_exception(0x28);
              std::operator+(&local_50,"Invalid PLY property definition: ",&line);
              gutil::IOException::IOException(pIVar12,&local_50);
              __cxa_throw(pIVar12,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
            }
            lVar11 = (long)list.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)list.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5;
            if (lVar11 == 5) {
              iVar8 = std::__cxx11::string::compare
                                ((char *)(list.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 1));
              if (iVar8 != 0) goto LAB_0011206c;
              psVar1 = list.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4;
              pVar9 = anon_unknown_3::PLYProperty::name2Type
                                (list.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 2);
              t_value = anon_unknown_3::PLYProperty::name2Type
                                  (list.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 3);
              anon_unknown_3::PLYProperty::PLYProperty
                        ((PLYProperty *)local_90,psVar1,pVar9,t_value,local_10c);
            }
            else {
              if (lVar11 != 3) {
LAB_0011206c:
                pIVar12 = (IOException *)__cxa_allocate_exception(0x28);
                std::operator+(&local_50,"Invalid PLY property definition: ",&line);
                gutil::IOException::IOException(pIVar12,&local_50);
                __cxa_throw(pIVar12,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
              }
              psVar1 = list.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 2;
              pVar9 = anon_unknown_3::PLYProperty::name2Type
                                (list.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1);
              anon_unknown_3::PLYProperty::PLYProperty
                        ((PLYProperty *)local_90,psVar1,pVar9,local_10c);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&list);
            PLYElement::addProperty(pPVar4,(PLYProperty *)local_90);
            anon_unknown_3::PLYProperty::~PLYProperty((PLYProperty *)local_90);
            piVar14 = local_98;
          }
        }
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>(piVar14,(string *)&line);
      gutil::trim((string *)&line);
    }
  }
  else {
    std::ifstream::close();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&format);
  uVar10 = std::__cxx11::string::~string((string *)&line);
  return (int)CONCAT71((int7)((ulong)uVar10 >> 8),cVar7 == 'y' && (cVar6 == 'l' && cVar5 == 'p'));
}

Assistant:

void write(std::streambuf *out, double v)
    {
      char s[40];
      snprintf(s, sizeof(s), "%.16g ", v);
      out->sputn(s, strlen(s));
    }